

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void Test_DeathSTREQ_logging::RunTest(void)

{
  undefined *puVar1;
  int iVar2;
  string *psVar3;
  long *plVar4;
  LogMessageData *pLVar5;
  string *extraout_RAX;
  ostream *poVar6;
  undefined1 local_a8 [24];
  long lStack_90;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar1 = google::g_logging_fail_func;
  google::g_called_abort = '\0';
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_((char *)0x0,"this","nullptr == \"this\"");
    if (psVar3 == (string *)0x0) goto LAB_00110497;
  }
  else {
LAB_00110497:
    if (google::g_called_abort == '\0') {
      google::g_logging_fail_func = puVar1;
      RunTest();
LAB_00110714:
      RunTest();
LAB_00110719:
      RunTest();
LAB_0011071e:
      RunTest();
LAB_00110723:
      RunTest();
LAB_00110728:
      RunTest();
    }
    else {
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                     ,0x2cb);
          poVar6 = google::LogMessage::stream((LogMessage *)local_a8);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_00110890;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_00110714;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_
                           ((char *)0x0,"siht","nullptr == \"siht\"");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                     ,0x2cc);
          poVar6 = google::LogMessage::stream((LogMessage *)local_a8);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_00110890;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_00110719;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                     ,0x2cd);
          poVar6 = google::LogMessage::stream((LogMessage *)local_a8);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_00110890;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_0011071e;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_
                           ((char *)0x0,(char *)0x0,"nullptr != nullptr");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                     ,0x2ce);
          poVar6 = google::LogMessage::stream((LogMessage *)local_a8);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_00110890;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_00110723;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_("this","this","\"this\" != \"this\"");
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                     ,0x2cf);
          poVar6 = google::LogMessage::stream((LogMessage *)local_a8);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_00110890;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort == '\0') goto LAB_00110728;
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"a","");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
        pLVar5 = (LogMessageData *)(plVar4 + 2);
        if ((LogMessageData *)*plVar4 == pLVar5) {
          local_a8._16_4_ = pLVar5->preserved_errno_;
          local_a8[0x14] = pLVar5->message_text_[0];
          local_a8[0x15] = pLVar5->message_text_[1];
          local_a8[0x16] = pLVar5->message_text_[2];
          local_a8[0x17] = pLVar5->message_text_[3];
          lStack_90 = plVar4[3];
          local_a8._0_8_ = (LogMessageData *)(local_a8 + 0x10);
        }
        else {
          local_a8._16_4_ = pLVar5->preserved_errno_;
          local_a8[0x14] = pLVar5->message_text_[0];
          local_a8[0x15] = pLVar5->message_text_[1];
          local_a8[0x16] = pLVar5->message_text_[2];
          local_a8[0x17] = pLVar5->message_text_[3];
          local_a8._0_8_ = (LogMessageData *)*plVar4;
        }
        local_a8._8_8_ = plVar4[1];
        *plVar4 = (long)pLVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_
                           ((char *)local_a8._0_8_,"abc",
                            "(string(\"a\") + \"b\").c_str() == \"abc\"");
        if ((LogMessageData *)local_a8._0_8_ != (LogMessageData *)(local_a8 + 0x10)) {
          free((void *)local_a8._0_8_);
        }
        if (local_48[0] != local_38) {
          free(local_48[0]);
        }
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                     ,0x2d0);
          poVar6 = google::LogMessage::stream((LogMessage *)local_a8);
          std::operator<<(poVar6,(string *)psVar3);
          goto LAB_00110890;
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort != '\0') {
        return;
      }
    }
    RunTest();
    psVar3 = extraout_RAX;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x2ca);
  poVar6 = google::LogMessage::stream((LogMessage *)local_a8);
  std::operator<<(poVar6,(string *)psVar3);
LAB_00110890:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a8);
}

Assistant:

TEST(DeathSTREQ, logging) {
  ASSERT_DEATH(CHECK_STREQ(nullptr, "this"), "");
  ASSERT_DEATH(CHECK_STREQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ(nullptr, "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRNE(nullptr, nullptr), "");
  ASSERT_DEATH(CHECK_STRNE("this", "this"), "");
  ASSERT_DEATH(CHECK_STREQ((string("a") + "b").c_str(), "abc"), "");
}